

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O1

void license::test_sign(parsed_options *parsed,variables_map *vm,char **argv,
                       options_description *global)

{
  char cVar1;
  int iVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  options_description_easy_init *poVar4;
  ostream *poVar5;
  logic_error *this;
  long *plVar6;
  long *plVar7;
  pointer *__ptr;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  string outputFile;
  string signedData;
  string data;
  string private_key_file;
  options_description license_desc;
  ofstream ofile;
  long *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  char *local_350;
  long local_348;
  char local_340 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_288 [24];
  void *local_270;
  undefined4 local_268;
  undefined8 local_260;
  undefined4 local_258;
  undefined8 local_250;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_248 [24];
  undefined1 local_230 [16];
  char local_220 [232];
  ios_base local_138 [264];
  
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"license issue options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_2b0,(string *)local_230,0x50,0x28);
  if ((char *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  local_230._0_8_ =
       boost::program_options::options_description::add_options((options_description *)local_2b0);
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_330);
  ptVar3->m_required = true;
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_230,"data,d",(value_semantic *)ptVar3,
                      "Data to be signed");
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_310);
  ptVar3->m_required = true;
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"primary-key,p",(value_semantic *)ptVar3,"Primary key location");
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_370);
  ptVar3->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"output,o",(value_semantic *)ptVar3,"file where to write output");
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"license issue","");
  rerunBoostPO(parsed,(options_description *)local_2b0,vm,argv,(string *)local_230,global);
  if ((char *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  CryptoHelper::getInstance();
  (**(code **)(*local_378 + 0x18))(local_378,&local_310);
  (**(code **)(*local_378 + 0x28))(&local_350,local_378,&local_330);
  iVar2 = std::__cxx11::string::compare((char *)&local_370);
  if (iVar2 == 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350,local_348);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream(local_230);
    std::ofstream::open((string *)local_230,(_Ios_Openmode)&local_370);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_2d0,"can\'t create [",&local_370);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_2f0 == plVar7) {
        local_2e0 = *plVar7;
        lStack_2d8 = plVar6[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *plVar7;
      }
      local_2e8 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::logic_error::logic_error(this,(string *)&local_2f0);
      __cxa_throw(this,std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,local_350,local_348);
    std::ofstream::close();
    local_230._0_8_ = (char *)0x0;
    *(undefined8 *)(local_230 + lRamffffffffffffffe8) = 0;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
  }
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  if (local_378 != (long *)0x0) {
    (**(code **)(*local_378 + 0x38))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_248);
  if (local_270 != (void *)0x0) {
    operator_delete(local_270);
    local_270 = (void *)0x0;
    local_268 = 0;
    local_260 = 0;
    local_258 = 0;
    local_250 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_288);
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0]);
  }
  return;
}

Assistant:

static void test_sign(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
					  const po::options_description &global) {
	po::options_description license_desc("license issue options");
	string private_key_file;
	string data;
	string outputFile;
	license_desc.add_options()  //
		("data,d", po::value<string>(&data)->required(), "Data to be signed")  //
		(PARAM_PRIMARY_KEY ",p", po::value<string>(&private_key_file)->required(), "Primary key location")  //
		("output,o", po::value<string>(&outputFile)->required(), "file where to write output");
	rerunBoostPO(parsed, license_desc, vm, argv, "license issue", global);
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->loadPrivateKey_file(private_key_file);
	string signedData(crypto->signString(data));
	if (outputFile != "cout") {
		ofstream ofile;
		ofile.open(outputFile, ios::trunc);
		if (!ofile.is_open()) {
			throw logic_error("can't create [" + outputFile + "]");
		}
		ofile << signedData;
		ofile.close();
	} else {
		cout << signedData << endl;
	}
}